

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ispalindrom.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  long lVar4;
  byte local_41;
  Settings local_40;
  
  name = *argv;
  local_41 = local_40._0_1_ & 0xfc;
  local_40.output = (FILE *)_stdout;
  pFVar3 = _stdout;
  local_40._0_1_ = local_41;
  while( true ) {
    while( true ) {
      while (iVar2 = __posix_getopt(argc,argv,"sio:"), iVar1 = _optind, iVar2 == 0x6f) {
        if (pFVar3 != _stdout) {
          fclose(pFVar3);
        }
        pFVar3 = fopen(_optarg,"w");
      }
      if (iVar2 != 0x69) break;
      local_41 = local_41 | 2;
    }
    if (iVar2 != 0x73) break;
    local_41 = local_41 | 1;
  }
  local_40.output = (FILE *)pFVar3;
  if (iVar2 == -1) {
    local_40._0_1_ = local_41;
    if (pFVar3 != (FILE *)0x0) {
      if (_optind < argc) {
        iVar2 = argc - _optind;
        lVar4 = 0;
        do {
          pFVar3 = fopen(argv[iVar1 + lVar4],"r");
          if (pFVar3 == (FILE *)0x0) {
            fprintf(_stderr,"%s ERROR:\t",name);
            fprintf(_stderr,"couldn\'t open file %s",argv[iVar1 + lVar4]);
            fputc(10,_stderr);
          }
          else {
            handle_file((FILE *)pFVar3,&local_40);
            fclose(pFVar3);
          }
          lVar4 = lVar4 + 1;
        } while (iVar2 != (int)lVar4);
      }
      else {
        handle_file(_stdin,&local_40);
      }
      exit(0);
    }
    fprintf(_stderr,"%s ERROR:\t",name);
    fwrite("couldn\'t open output-file",0x19,1,_stderr);
    fputc(10,_stderr);
  }
  else {
    local_40._0_1_ = local_41;
    fprintf(_stdout,"USAGE: %s [-s] [-i] [-o outfile] [file...]\n",name);
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{

	name = argv[0];

	Settings set = {0, 0, stdout};

	int i = handle_arguments(&set, argc, &argv);

	if (i >= argc) //no additional arguments, read from stdin
	{ 
		handle_file(stdin, &set);
	}
	else
	{
		for (; i < argc; i++)
		{

			FILE *input = fopen(argv[i], "r");
			if (input == NULL)
			{
				ERROR_MSG("couldn't open file %s", argv[i]); //give warning, ignore file and continue
				continue;
			}
			handle_file(input, &set);
			fclose(input);
		}
	}
	exit(EXIT_SUCCESS);
}